

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  Snapshot snapshot;
  bool bVar1;
  WorkingMode WVar2;
  char *pcVar3;
  cmLocalGenerator *pcVar4;
  cmMakefile *pcVar5;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  bool bVar6;
  allocator local_199;
  string local_198;
  undefined1 local_178 [8];
  string file;
  string local_138;
  PositionType local_118;
  Snapshot local_108;
  auto_ptr<cmLocalGenerator> local_f0;
  auto_ptr<cmLocalGenerator> lg;
  string local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string homeOutputDir;
  undefined1 local_78 [8];
  string homeDir;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_50;
  PositionType local_48;
  cmGlobalGenerator *pcStack_28;
  bool created;
  cmGlobalGenerator *gg;
  char *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  pcStack_28 = GetGlobalGenerator(this);
  bVar6 = pcStack_28 == (cmGlobalGenerator *)0x0;
  if (bVar6) {
    pcStack_28 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(pcStack_28,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((Snapshot *)((long)&homeDir.field_2 + 8),this->State);
    (this->CurrentSnapshot).Position.Position = local_48;
    (this->CurrentSnapshot).State = (cmState *)homeDir.field_2._8_8_;
    (this->CurrentSnapshot).Position.Tree = pcStack_50;
    pcVar3 = GetHomeDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_78,pcVar3,(allocator *)(homeOutputDir.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(homeOutputDir.field_2._M_local_buf + 0xf));
    pcVar3 = GetHomeOutputDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,pcVar3,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_c8,(SystemTools *)0x1,collapse)
    ;
    SetHomeDirectory(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&lg,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,(string *)&lg);
    std::__cxx11::string::~string((string *)&lg);
    cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_118);
    cmState::Snapshot::Snapshot(&local_108,(cmState *)0x0,local_118);
    snapshot.Position.Tree = local_108.Position.Tree;
    snapshot.State = local_108.State;
    snapshot.Position.Position = local_108.Position.Position;
    pcVar4 = cmGlobalGenerator::MakeLocalGenerator(pcStack_28,snapshot,(cmLocalGenerator *)0x0);
    cmsys::auto_ptr<cmLocalGenerator>::auto_ptr(&local_f0,pcVar4);
    pcVar4 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_f0);
    pcVar5 = cmLocalGenerator::GetMakefile(pcVar4);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_138,(SystemTools *)0x1,collapse_01);
    cmMakefile::SetCurrentBinaryDirectory(pcVar5,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    pcVar4 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_f0);
    pcVar5 = cmLocalGenerator::GetMakefile(pcVar4);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)((long)&file.field_2 + 8),(SystemTools *)0x1,collapse_02);
    cmMakefile::SetCurrentSourceDirectory(pcVar5,(string *)((long)&file.field_2 + 8));
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    WVar2 = GetWorkingMode(this);
    if (WVar2 != NORMAL_MODE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,path,&local_199);
      cmsys::SystemTools::CollapseFullPath((string *)local_178,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_178);
      pcVar4 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_f0);
      pcVar5 = cmLocalGenerator::GetMakefile(pcVar4);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::SetScriptModeFile(pcVar5,pcVar3);
      pcVar4 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_f0);
      pcVar5 = cmLocalGenerator::GetMakefile(pcVar4);
      cmMakefile::SetArgcArgv(pcVar5,args);
      std::__cxx11::string::~string((string *)local_178);
    }
    pcVar4 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_f0);
    pcVar5 = cmLocalGenerator::GetMakefile(pcVar4);
    bVar1 = cmMakefile::ReadListFile(pcVar5,path);
    if (!bVar1) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    SetHomeDirectory(this,(string *)local_78);
    SetHomeOutputDirectory(this,(string *)local_a0);
    cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr(&local_f0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((bVar6) && (pcStack_28 != (cmGlobalGenerator *)0x0)) {
    (*pcStack_28->_vptr_cmGlobalGenerator[1])();
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char *path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg)
    {
    gg = new cmGlobalGenerator(this);
    created = true;
    }

  // read in the list file to fill the cache
  if(path)
    {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
    lg->GetMakefile()->SetCurrentBinaryDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    lg->GetMakefile()->SetCurrentSourceDirectory
      (cmSystemTools::GetCurrentWorkingDirectory());
    if (this->GetWorkingMode() != NORMAL_MODE)
      {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      lg->GetMakefile()->SetScriptModeFile(file.c_str());

      lg->GetMakefile()->SetArgcArgv(args);
      }
    if (!lg->GetMakefile()->ReadListFile(path))
      {
      cmSystemTools::Error("Error processing file: ", path);
      }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
    }

  // free generic one if generated
  if (created)
    {
    delete gg;
    }
}